

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O0

void VR4_SSE2(uint8_t *dst)

{
  ulong uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  undefined1 auVar6 [16];
  ulong uVar7;
  uint8_t *in_RDI;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined1 uVar18;
  undefined1 uVar19;
  undefined1 uVar20;
  undefined1 uVar21;
  undefined1 uVar22;
  undefined1 uVar23;
  undefined1 uVar24;
  undefined1 uVar25;
  undefined1 uVar26;
  undefined1 uVar27;
  undefined1 uVar28;
  undefined1 auVar10 [16];
  __m128i efgh;
  __m128i avg2;
  __m128i lsb;
  __m128i avg1;
  __m128i IXABCD;
  __m128i _XABCD;
  __m128i abcd;
  __m128i ABCD0;
  __m128i XABCD;
  int X;
  int K;
  int J;
  int I;
  __m128i one;
  uint32_t local_178;
  uint32_t local_158;
  undefined1 local_58;
  undefined1 uStack_57;
  undefined1 uStack_56;
  undefined1 uStack_55;
  undefined1 uStack_54;
  undefined1 uStack_53;
  undefined1 uStack_52;
  undefined1 uStack_51;
  undefined1 uStack_50;
  undefined1 uStack_4f;
  undefined1 uStack_4e;
  undefined1 uStack_4d;
  undefined1 uStack_4c;
  undefined1 uStack_4b;
  undefined1 uStack_4a;
  undefined1 uStack_49;
  undefined1 uStack_36;
  undefined1 uStack_35;
  undefined1 uStack_34;
  undefined1 uStack_33;
  undefined1 uStack_32;
  undefined1 uStack_31;
  undefined1 local_18;
  undefined1 uStack_17;
  undefined1 uStack_16;
  undefined1 uStack_15;
  undefined1 uStack_14;
  undefined1 uStack_13;
  undefined1 uStack_12;
  undefined1 uStack_11;
  
  bVar2 = in_RDI[-1];
  bVar3 = in_RDI[0x1f];
  bVar4 = in_RDI[0x3f];
  bVar5 = in_RDI[-0x21];
  uVar1 = *(ulong *)(in_RDI + -0x21);
  local_18 = (undefined1)uVar1;
  uStack_17 = (undefined1)(uVar1 >> 8);
  uStack_16 = (undefined1)(uVar1 >> 0x10);
  uStack_15 = (undefined1)(uVar1 >> 0x18);
  uStack_14 = (undefined1)(uVar1 >> 0x20);
  uStack_13 = (undefined1)(uVar1 >> 0x28);
  uStack_12 = (undefined1)(uVar1 >> 0x30);
  uStack_11 = (undefined1)(uVar1 >> 0x38);
  uVar8 = pavgb(local_18,uStack_17);
  uVar11 = pavgb(uStack_17,uStack_16);
  uVar13 = pavgb(uStack_16,uStack_15);
  uVar15 = pavgb(uStack_15,uStack_14);
  pavgb(uStack_14,uStack_13);
  pavgb(uStack_13,uStack_12);
  pavgb(uStack_12,uStack_11);
  pavgb(uStack_11,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  uVar7 = uVar1 & 0xffffffffffff00;
  uStack_36 = (undefined1)(uVar7 >> 8);
  uStack_35 = (undefined1)(uVar7 >> 0x10);
  uStack_34 = (undefined1)(uVar7 >> 0x18);
  uStack_33 = (undefined1)(uVar7 >> 0x20);
  uStack_32 = (undefined1)(uVar7 >> 0x28);
  uStack_31 = (undefined1)(uVar7 >> 0x30);
  uVar9 = pavgb(bVar2,uStack_17);
  uVar12 = pavgb(bVar5,uStack_16);
  uVar14 = pavgb(uStack_36,uStack_15);
  uVar16 = pavgb(uStack_35,uStack_14);
  uVar17 = pavgb(uStack_34,uStack_13);
  uVar18 = pavgb(uStack_33,uStack_12);
  uVar19 = pavgb(uStack_32,uStack_11);
  uVar20 = pavgb(uStack_31,0);
  uVar21 = pavgb(uStack_11,0);
  uVar22 = pavgb(0,0);
  uVar23 = pavgb(0,0);
  uVar24 = pavgb(0,0);
  uVar25 = pavgb(0,0);
  uVar26 = pavgb(0,0);
  uVar27 = pavgb(0,0);
  uVar28 = pavgb(0,0);
  auVar6[1] = uVar12;
  auVar6[0] = uVar9;
  auVar6[2] = uVar14;
  auVar6[3] = uVar16;
  auVar6[4] = uVar17;
  auVar6[5] = uVar18;
  auVar6[6] = uVar19;
  auVar6[7] = uVar20;
  auVar6[9] = uVar22;
  auVar6[8] = uVar21;
  auVar6[10] = uVar23;
  auVar6[0xb] = uVar24;
  auVar6[0xc] = uVar25;
  auVar6[0xd] = uVar26;
  auVar6[0xe] = uVar27;
  auVar6[0xf] = uVar28;
  auVar10._8_8_ = uVar1 >> 0x38 & 0x1010101010101;
  auVar10._0_8_ = ((uVar7 << 8 | (ulong)CONCAT11(bVar5,bVar2)) ^ uVar1 >> 8) & 0x101010101010101;
  auVar10 = psubusb(auVar6,auVar10);
  local_58 = auVar10[0];
  uStack_57 = auVar10[1];
  uStack_56 = auVar10[2];
  uStack_55 = auVar10[3];
  uStack_54 = auVar10[4];
  uStack_53 = auVar10[5];
  uStack_52 = auVar10[6];
  uStack_51 = auVar10[7];
  uStack_50 = auVar10[8];
  uStack_4f = auVar10[9];
  uStack_4e = auVar10[10];
  uStack_4d = auVar10[0xb];
  uStack_4c = auVar10[0xc];
  uStack_4b = auVar10[0xd];
  uStack_4a = auVar10[0xe];
  uStack_49 = auVar10[0xf];
  uVar9 = pavgb(local_58,local_18);
  uVar12 = pavgb(uStack_57,uStack_17);
  uVar14 = pavgb(uStack_56,uStack_16);
  uVar16 = pavgb(uStack_55,uStack_15);
  pavgb(uStack_54,uStack_14);
  pavgb(uStack_53,uStack_13);
  pavgb(uStack_52,uStack_12);
  pavgb(uStack_51,uStack_11);
  pavgb(uStack_50,0);
  pavgb(uStack_4f,0);
  pavgb(uStack_4e,0);
  pavgb(uStack_4d,0);
  pavgb(uStack_4c,0);
  pavgb(uStack_4b,0);
  pavgb(uStack_4a,0);
  pavgb(uStack_49,0);
  WebPUint32ToMem(in_RDI,CONCAT13(uVar15,CONCAT12(uVar13,CONCAT11(uVar11,uVar8))));
  WebPUint32ToMem(in_RDI + 0x20,CONCAT13(uVar16,CONCAT12(uVar14,CONCAT11(uVar12,uVar9))));
  local_158 = CONCAT13(uVar15,CONCAT12(uVar13,CONCAT11(uVar11,uVar8))) << 8;
  WebPUint32ToMem(in_RDI + 0x40,local_158);
  local_178 = CONCAT13(uVar16,CONCAT12(uVar14,CONCAT11(uVar12,uVar9))) << 8;
  WebPUint32ToMem(in_RDI + 0x60,local_178);
  in_RDI[0x40] = (uint8_t)((int)((uint)bVar3 + (uint)bVar2 * 2 + (uint)bVar5 + 2) >> 2);
  in_RDI[0x60] = (uint8_t)((int)((uint)bVar4 + (uint)bVar3 * 2 + (uint)bVar2 + 2) >> 2);
  return;
}

Assistant:

static void VR4_SSE2(uint8_t* dst) {   // Vertical-Right
  const __m128i one = _mm_set1_epi8(1);
  const int I = dst[-1 + 0 * BPS];
  const int J = dst[-1 + 1 * BPS];
  const int K = dst[-1 + 2 * BPS];
  const int X = dst[-1 - BPS];
  const __m128i XABCD = _mm_loadl_epi64((__m128i*)(dst - BPS - 1));
  const __m128i ABCD0 = _mm_srli_si128(XABCD, 1);
  const __m128i abcd = _mm_avg_epu8(XABCD, ABCD0);
  const __m128i _XABCD = _mm_slli_si128(XABCD, 1);
  const __m128i IXABCD = _mm_insert_epi16(_XABCD, (short)(I | (X << 8)), 0);
  const __m128i avg1 = _mm_avg_epu8(IXABCD, ABCD0);
  const __m128i lsb = _mm_and_si128(_mm_xor_si128(IXABCD, ABCD0), one);
  const __m128i avg2 = _mm_subs_epu8(avg1, lsb);
  const __m128i efgh = _mm_avg_epu8(avg2, XABCD);
  WebPUint32ToMem(dst + 0 * BPS, _mm_cvtsi128_si32(               abcd    ));
  WebPUint32ToMem(dst + 1 * BPS, _mm_cvtsi128_si32(               efgh    ));
  WebPUint32ToMem(dst + 2 * BPS, _mm_cvtsi128_si32(_mm_slli_si128(abcd, 1)));
  WebPUint32ToMem(dst + 3 * BPS, _mm_cvtsi128_si32(_mm_slli_si128(efgh, 1)));

  // these two are hard to implement in SSE2, so we keep the C-version:
  DST(0, 2) = AVG3(J, I, X);
  DST(0, 3) = AVG3(K, J, I);
}